

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O0

int light_get_next_packet
              (light_pcapng_t *pcapng,light_packet_header *packet_header,uint8_t **packet_data)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint16_t uVar4;
  light_option option_00;
  uint32_t *puVar5;
  light_pcapng p_Var6;
  undefined8 *in_RDX;
  uint *in_RSI;
  long in_RDI;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  light_option option;
  _light_simple_packet_block *spb;
  double timestamp_res;
  uint64_t timestamp;
  _light_enhanced_packet_block *epb;
  uint32_t type;
  light_pcapng_file_info *in_stack_ffffffffffffffb8;
  uint *puVar10;
  light_pcapng in_stack_ffffffffffffffc0;
  uint *local_30;
  int local_24;
  undefined8 *local_20;
  uint *local_18;
  long local_10;
  int local_4;
  
  local_24 = -0x21524111;
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_4 = 0;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    light_get_block_info(*(light_pcapng *)(in_RDI + 0x10),LIGHT_INFO_TYPE,&local_24,(size_t *)0x0);
    while( true ) {
      bVar7 = false;
      if ((*(long *)(local_10 + 0x10) != 0) && (bVar7 = false, local_24 != 6)) {
        bVar7 = local_24 != 3;
      }
      if (!bVar7) break;
      if (local_24 == 1) {
        __append_interface_block_to_file_info(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      p_Var6 = light_next_block(*(light_pcapng *)(local_10 + 0x10));
      *(light_pcapng *)(local_10 + 0x10) = p_Var6;
      if (*(long *)(local_10 + 0x10) == 0) break;
      light_get_block_info
                (*(light_pcapng *)(local_10 + 0x10),LIGHT_INFO_TYPE,&local_24,(size_t *)0x0);
    }
    *local_20 = 0;
    if (*(long *)(local_10 + 0x10) == 0) {
      local_4 = 0;
    }
    else {
      if (local_24 == 6) {
        local_30 = (uint *)0x0;
        light_get_block_info
                  (*(light_pcapng *)(local_10 + 0x10),LIGHT_INFO_BODY,&local_30,(size_t *)0x0);
        *local_18 = *local_30;
        local_18[6] = local_30[3];
        local_18[7] = local_30[4];
        uVar2 = local_30[1];
        uVar3 = local_30[2];
        dVar1 = *(double *)(*(long *)(local_10 + 8) + 0x90 + (ulong)*local_30 * 8);
        auVar8._8_4_ = uVar2;
        auVar8._0_8_ = CONCAT44(uVar2,uVar3);
        auVar8._12_4_ = 0x45300000;
        *(long *)(local_18 + 2) =
             (long)(((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0)) * dVar1);
        auVar9._8_4_ = uVar2;
        auVar9._0_8_ = CONCAT44(uVar2,uVar3);
        auVar9._12_4_ = 0x45300000;
        *(long *)(local_18 + 4) =
             (long)((((auVar9._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0)) -
                    (double)*(long *)(local_18 + 2) / dVar1) * dVar1 * 1000000.0);
        if ((ulong)*local_30 < *(ulong *)(*(long *)(local_10 + 8) + 0x48)) {
          *(undefined2 *)(local_18 + 8) =
               *(undefined2 *)(*(long *)(local_10 + 8) + 0x50 + (ulong)*local_30 * 2);
        }
        *local_20 = local_30 + 5;
      }
      else if (local_24 == 3) {
        puVar10 = (uint *)0x0;
        light_get_block_info
                  (*(light_pcapng *)(local_10 + 0x10),LIGHT_INFO_BODY,&stack0xffffffffffffffb8,
                   (size_t *)0x0);
        *local_18 = 0;
        local_18[6] = *puVar10;
        local_18[7] = *puVar10;
        local_18[2] = 0;
        local_18[3] = 0;
        local_18[4] = 0;
        local_18[5] = 0;
        if (*(long *)(*(long *)(local_10 + 8) + 0x48) != 0) {
          *(undefined2 *)(local_18 + 8) = *(undefined2 *)(*(long *)(local_10 + 8) + 0x50);
        }
        *local_20 = puVar10 + 1;
      }
      local_18[10] = 0;
      local_18[0xb] = 0;
      *(undefined2 *)(local_18 + 0xc) = 0;
      option_00 = light_get_option(*(light_pcapng *)(local_10 + 0x10),1);
      if (option_00 != (light_option)0x0) {
        uVar4 = light_get_option_length(option_00);
        *(uint16_t *)(local_18 + 0xc) = uVar4;
        puVar5 = light_get_option_data(option_00);
        *(uint32_t **)(local_18 + 10) = puVar5;
      }
      p_Var6 = light_next_block(*(light_pcapng *)(local_10 + 0x10));
      *(light_pcapng *)(local_10 + 0x10) = p_Var6;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int light_get_next_packet(light_pcapng_t *pcapng, light_packet_header *packet_header, const uint8_t **packet_data)
{
	uint32_t type = LIGHT_UNKNOWN_DATA_BLOCK;

	if (pcapng->pcapng_iter == NULL)
		return 0;

	light_get_block_info(pcapng->pcapng_iter, LIGHT_INFO_TYPE, &type, NULL);

	while (pcapng->pcapng_iter != NULL && type != LIGHT_ENHANCED_PACKET_BLOCK && type != LIGHT_SIMPLE_PACKET_BLOCK)
	{
		if (type == LIGHT_INTERFACE_BLOCK)
			__append_interface_block_to_file_info(pcapng->pcapng_iter, pcapng->file_info);

		pcapng->pcapng_iter = light_next_block(pcapng->pcapng_iter);
		if (pcapng->pcapng_iter == NULL)
			break;
		light_get_block_info(pcapng->pcapng_iter, LIGHT_INFO_TYPE, &type, NULL);
	}

	*packet_data = NULL;

	if (pcapng->pcapng_iter == NULL)
		return 0;

	if (type == LIGHT_ENHANCED_PACKET_BLOCK)
	{
		struct _light_enhanced_packet_block *epb = NULL;

		light_get_block_info(pcapng->pcapng_iter, LIGHT_INFO_BODY, &epb, NULL);

		packet_header->interface_id = epb->interface_id;
		packet_header->captured_length = epb->capture_packet_length;
		packet_header->original_length = epb->original_capture_length;
		uint64_t timestamp = epb->timestamp_high;
		timestamp = timestamp << 32;
		timestamp += epb->timestamp_low;
		double timestamp_res = pcapng->file_info->timestamp_resolution[epb->interface_id];
		packet_header->timestamp.tv_sec = timestamp * timestamp_res;
		packet_header->timestamp.tv_usec = (timestamp - (packet_header->timestamp.tv_sec / timestamp_res))*timestamp_res*1000000;
		if (epb->interface_id < pcapng->file_info->interface_block_count)
			packet_header->data_link = pcapng->file_info->link_types[epb->interface_id];

		*packet_data = (uint8_t*)epb->packet_data;
	}

	else if (type == LIGHT_SIMPLE_PACKET_BLOCK)
	{
		struct _light_simple_packet_block *spb = NULL;

		light_get_block_info(pcapng->pcapng_iter, LIGHT_INFO_BODY, &spb, NULL);

		packet_header->interface_id = 0;
		packet_header->captured_length = spb->original_packet_length;
		packet_header->original_length = spb->original_packet_length;
		packet_header->timestamp.tv_sec = 0;
		packet_header->timestamp.tv_usec = 0;
		if (pcapng->file_info->interface_block_count > 0)
			packet_header->data_link = pcapng->file_info->link_types[0];

		*packet_data = (uint8_t*)spb->packet_data;
	}

	packet_header->comment = NULL;
	packet_header->comment_length = 0;

	light_option option = light_get_option(pcapng->pcapng_iter, 1); // get comment
	if (option != NULL)
	{
		packet_header->comment_length = light_get_option_length(option);
		packet_header->comment = (char*)light_get_option_data(option);
	}

	pcapng->pcapng_iter = light_next_block(pcapng->pcapng_iter);

	return 1;
}